

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O3

void __thiscall nonius::standard_reporter::do_configure(standard_reporter *this,configuration *cfg)

{
  bool bVar1;
  basic_ostream<char,_std::char_traits<char>_> *os;
  
  this->n_samples = cfg->samples;
  this->verbose = cfg->verbose;
  bVar1 = cfg->summary;
  this->summary = bVar1;
  this->n_resamples = cfg->resamples;
  if ((bVar1 == false) &&
     ((cfg->params).map.
      super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>_>_>
      ._M_h._M_element_count != 0)) {
    if ((this->super_reporter).os.super__Function_base._M_manager != (_Manager_type)0x0) {
      os = (*(this->super_reporter).os._M_invoker)((_Any_data *)&(this->super_reporter).os);
      std::__ostream_insert<char,std::char_traits<char>>(os,"parameters\n",0xb);
      operator<<(os,&(cfg->params).map);
      return;
    }
    std::__throw_bad_function_call();
  }
  return;
}

Assistant:

void do_configure(configuration& cfg) override {
            n_samples = cfg.samples;
            verbose = cfg.verbose;
            summary = cfg.summary;
            n_resamples = cfg.resamples;
            if(!summary && !cfg.params.map.empty()) report_stream() << "parameters\n" << cfg.params.map;
        }